

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maybe.hpp
# Opt level: O1

maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> *
__thiscall
pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
::operator=(maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
            *this,maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                  *other)

{
  anon_struct_8_0_00000001_for___align aVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *other_00;
  
  if (other != this) {
    if (other->valid_ == false) {
      if (this->valid_ == true) {
        this->valid_ = false;
        aVar1 = (anon_struct_8_0_00000001_for___align)((long)&this->storage_ + 0x10);
        if ((this->storage_).__align != aVar1) {
          operator_delete((void *)(this->storage_).__align,*(long *)aVar1 + 1);
        }
      }
    }
    else {
      other_00 = maybe<std::__cxx11::string,void>::
                 value_impl<pstore::maybe<std::__cxx11::string,void>&,std::__cxx11::string>(other);
      maybe<std::__cxx11::string,void>::operator=((maybe<std::__cxx11::string,void> *)this,other_00)
      ;
    }
  }
  return this;
}

Assistant:

maybe &
        operator= (maybe && other) noexcept (std::is_nothrow_move_assignable<T>::value &&
                                                 std::is_nothrow_move_constructible<T>::value) {

            if (&other != this) {
                if (!other.has_value ()) {
                    this->reset ();
                } else {
                    this->operator= (std::forward<T> (other.value ()));
                }
            }
            return *this;
        }